

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O1

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path)

{
  RepeatedField<int> *this_00;
  int iVar1;
  uint uVar2;
  GeneratedCodeInfo *pGVar3;
  Rep *pRVar4;
  GeneratedCodeInfo_Annotation *obj;
  void *pvVar5;
  pointer piVar6;
  int *piVar7;
  undefined8 *puVar8;
  ulong uVar9;
  int tmp;
  
  pGVar3 = this->annotation_proto_;
  pRVar4 = (pGVar3->annotation_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar4 != (Rep *)0x0) {
    iVar1 = (pGVar3->annotation_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar4->allocated_size) {
      (pGVar3->annotation_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar5 = pRVar4->elements[iVar1];
      goto LAB_0023c8e5;
    }
  }
  obj = Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo_Annotation>
                  ((pGVar3->annotation_).super_RepeatedPtrFieldBase.arena_);
  pvVar5 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pGVar3->annotation_).super_RepeatedPtrFieldBase,obj);
LAB_0023c8e5:
  piVar6 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar6) {
    this_00 = (RepeatedField<int> *)((long)pvVar5 + 0x18);
    uVar9 = 0;
    do {
      iVar1 = piVar6[uVar9];
      uVar2 = *(uint *)((long)pvVar5 + 0x18);
      if (uVar2 == *(uint *)((long)pvVar5 + 0x1c)) {
        RepeatedField<int>::Reserve(this_00,*(uint *)((long)pvVar5 + 0x1c) + 1);
      }
      piVar7 = RepeatedField<int>::elements(this_00);
      piVar7[uVar2] = iVar1;
      this_00->current_size_ = uVar2 + 1;
      uVar9 = uVar9 + 1;
      piVar6 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
    } while (uVar9 < (ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar6 >> 2));
  }
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 1;
  puVar8 = (undefined8 *)(*(ulong *)((long)pvVar5 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar5 + 8) & 1) != 0) {
    puVar8 = (undefined8 *)*puVar8;
  }
  internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar5 + 0x30),file_path,puVar8);
  *(int *)((long)pvVar5 + 0x38) = (int)begin_offset;
  *(byte *)((long)pvVar5 + 0x10) = *(byte *)((long)pvVar5 + 0x10) | 6;
  *(int *)((long)pvVar5 + 0x3c) = (int)end_offset;
  return;
}

Assistant:

void AddAnnotation(size_t begin_offset, size_t end_offset,
                     const std::string& file_path,
                     const std::vector<int>& path) override {
    typename AnnotationProto::Annotation* annotation =
        annotation_proto_->add_annotation();
    for (int i = 0; i < path.size(); ++i) {
      annotation->add_path(path[i]);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);
  }